

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void arena_new_create_background_thread(tsdn_t *tsdn,uint ind)

{
  _Bool _Var1;
  
  if (ind != 0) {
    _Var1 = duckdb_je_background_thread_create(&tsdn->tsd,ind);
    if (_Var1) {
      duckdb_je_malloc_printf
                ("<jemalloc>: error in background thread creation for arena %u. Abort.\n",ind);
      abort();
    }
  }
  return;
}

Assistant:

static void
arena_new_create_background_thread(tsdn_t *tsdn, unsigned ind) {
	if (ind == 0) {
		return;
	}

	if (have_background_thread) {
		if (background_thread_create(tsdn_tsd(tsdn), ind)) {
			malloc_printf("<jemalloc>: error in background thread "
				      "creation for arena %u. Abort.\n", ind);
			abort();
		}
	}
}